

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

void Sbd_NtkPerformOne(Sbd_Man_t *p,int Pivot)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  Sbd_Par_t *pSVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int nStrs;
  word Truth;
  Sbd_Str_t Strs [10];
  int local_254;
  word local_250;
  Sbd_Str_t local_248 [10];
  
  local_250 = 0;
  local_254 = 0;
  if ((p->pSto == (Sbd_Sto_t *)0x0) && (iVar3 = Sbd_ManMergeCuts(p,Pivot), iVar3 != 0)) {
    return;
  }
  iVar3 = Sbd_ManWindow(p,Pivot);
  if (iVar3 == 0) {
    return;
  }
  uVar1 = p->nTried;
  uVar2 = p->nUsed;
  p->nTried = uVar1 + 1;
  p->nUsed = uVar2 + 1;
  iVar3 = Sbd_ManCheckConst(p,Pivot);
  if (-1 < iVar3) {
    if ((-1 < Pivot) && (Pivot < p->vMirrors->nSize)) {
      p->vMirrors->pArray[(uint)Pivot] = iVar3;
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  pSVar5 = p->pPars;
  if ((pSVar5->fFindDivs != 0) && (0 < pSVar5->nLutNum)) {
    iVar3 = Sbd_ManExplore2(p,Pivot,&local_250);
    if (iVar3 != 0) {
      local_248[0].fLut = 1;
      local_248[0].nVarIns = p->vDivSet->nSize;
      if (0 < (long)local_248[0].nVarIns) {
        lVar6 = (long)local_248[0].nVarIns + -1;
        auVar8._8_4_ = (int)lVar6;
        auVar8._0_8_ = lVar6;
        auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
        uVar7 = 0;
        auVar8 = auVar8 ^ _DAT_0093d220;
        auVar9 = _DAT_0093d210;
        do {
          auVar10 = auVar9 ^ _DAT_0093d220;
          if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                      auVar8._4_4_ < auVar10._4_4_) & 1)) {
            local_248[0].VarIns[uVar7] = (int)uVar7;
          }
          if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
              auVar10._12_4_ <= auVar8._12_4_) {
            local_248[0].VarIns[uVar7 + 1] = (int)uVar7 + 1;
          }
          uVar7 = uVar7 + 2;
          lVar6 = auVar9._8_8_;
          auVar9._0_8_ = auVar9._0_8_ + 2;
          auVar9._8_8_ = lVar6 + 2;
        } while ((local_248[0].nVarIns + 1U & 0xfffffffe) != uVar7);
      }
      local_248[0].Res = local_250;
      iVar3 = 1;
      goto LAB_00541e39;
    }
    pSVar5 = p->pPars;
  }
  if ((pSVar5->nLutNum < 2) ||
     (iVar4 = Sbd_ManExplore3(p,Pivot,&local_254,local_248), iVar3 = local_254, iVar4 == 0)) {
    p->nUsed = p->nUsed + -1;
    return;
  }
LAB_00541e39:
  Sbd_ManImplement2(p,Pivot,iVar3,local_248);
  return;
}

Assistant:

void Sbd_NtkPerformOne( Sbd_Man_t * p, int Pivot )
{
    Sbd_Str_t Strs[SBD_DIV_MAX]; word Truth = 0;
    int RetValue, nStrs = 0;
    if ( !p->pSto && Sbd_ManMergeCuts( p, Pivot ) )
        return;
    if ( !Sbd_ManWindow( p, Pivot ) )
        return;
    //if ( Vec_IntSize(p->vWinObjs) > 100 )
    //    printf( "Obj %d : Win = %d   TFO = %d.  Roots = %d.\n", Pivot, Vec_IntSize(p->vWinObjs), Vec_IntSize(p->vTfo), Vec_IntSize(p->vRoots) );
    p->nTried++;
    p->nUsed++;
    RetValue = Sbd_ManCheckConst( p, Pivot );
    if ( RetValue >= 0 )
    {
        Vec_IntWriteEntry( p->vMirrors, Pivot, RetValue );
        //if ( p->pPars->fVerbose ) printf( "Node %5d:  Detected constant %d.\n", Pivot, RetValue );
    }
    else if ( p->pPars->fFindDivs && p->pPars->nLutNum >= 1 && Sbd_ManExplore2( p, Pivot, &Truth ) )
    {
        int i;
        Strs->fLut = 1;
        Strs->nVarIns = Vec_IntSize( p->vDivSet );
        for ( i = 0; i < Strs->nVarIns; i++ )
            Strs->VarIns[i] = i;
        Strs->Res = Truth;
        Sbd_ManImplement2( p, Pivot, 1, Strs );
        //if ( p->pPars->fVerbose ) printf( "Node %5d:  Detected LUT%d\n", Pivot, p->pPars->nLutSize );
    }
    else if ( p->pPars->nLutNum >= 2 && Sbd_ManExplore3( p, Pivot, &nStrs, Strs ) )
    {
        Sbd_ManImplement2( p, Pivot, nStrs, Strs );
        if ( !p->pPars->fVerbose ) 
            return;
        //if ( Vec_IntSize(p->vDivSet) <= 4 )
        //    printf( "Node %5d:  Detected %d\n", Pivot, p->pPars->nLutSize );
        //else if ( Vec_IntSize(p->vDivSet) <= 6 || (Vec_IntSize(p->vDivSet) == 7 && nStrs == 2) )
        //    printf( "Node %5d:  Detected %d%d\n", Pivot, p->pPars->nLutSize, p->pPars->nLutSize );
        //else 
        //    printf( "Node %5d:  Detected %d%d%d\n", Pivot, p->pPars->nLutSize, p->pPars->nLutSize, p->pPars->nLutSize );
    }
    else
        p->nUsed--;
}